

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HarmonicTorsionType.hpp
# Opt level: O3

void __thiscall
OpenMD::HarmonicTorsionType::calcForce
          (HarmonicTorsionType *this,RealType cosPhi,RealType *V,RealType *dVdCosPhi)

{
  ulong uVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  dVar3 = 1.0;
  if ((cosPhi <= 1.0) && (dVar3 = cosPhi, cosPhi < -1.0)) {
    dVar3 = -1.0;
  }
  dVar2 = acos(dVar3);
  dVar3 = 1.0 - dVar3 * dVar3;
  if (dVar3 < 0.0) {
    dVar3 = sqrt(dVar3);
  }
  else {
    dVar3 = SQRT(dVar3);
  }
  uVar1 = (ulong)DAT_002d2200;
  dVar4 = dVar2 - this->phi0_;
  *V = dVar4 * dVar4 * this->d0_ * 0.5;
  *dVdCosPhi = ((dVar2 - this->phi0_) * -this->d0_) /
               (double)(~-(ulong)(ABS(dVar3) < 1e-06) & (ulong)dVar3 |
                       ((ulong)dVar3 & 0x8000000000000000 | uVar1) & -(ulong)(ABS(dVar3) < 1e-06));
  return;
}

Assistant:

virtual void calcForce(RealType cosPhi, RealType& V, RealType& dVdCosPhi) {
      // check roundoff
      if (cosPhi > 1.0) {
        cosPhi = 1.0;
      } else if (cosPhi < -1.0) {
        cosPhi = -1.0;
      }

      RealType phi    = acos(cosPhi);
      RealType sinPhi = sqrt(1.0 - cosPhi * cosPhi);

      // trick to avoid divergence in angles near 0 and pi:

      if (fabs(sinPhi) < 1.0E-6) { sinPhi = copysign(1.0E-6, sinPhi); }

      V = 0.5 * d0_ * pow((phi - phi0_), 2);

      dVdCosPhi = -d0_ * (phi - phi0_) / sinPhi;
    }